

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReconv.c
# Opt level: O3

void Abc_NodeConeCollect(Abc_Obj_t **ppRoots,int nRoots,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vVisited,
                        int fIncludeFanins)

{
  uint *puVar1;
  void *pvVar2;
  long lVar3;
  void **ppvVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  
  if (0 < vLeaves->nSize) {
    lVar3 = 0;
    do {
      puVar1 = (uint *)((long)vLeaves->pArray[lVar3] + 0x14);
      *puVar1 = *puVar1 | 0x10;
      lVar3 = lVar3 + 1;
    } while (lVar3 < vLeaves->nSize);
  }
  vVisited->nSize = 0;
  if ((fIncludeFanins != 0) && (0 < vLeaves->nSize)) {
    uVar7 = (ulong)(uint)vVisited->nCap;
    iVar5 = 0;
    lVar3 = 0;
    do {
      pvVar2 = vLeaves->pArray[lVar3];
      iVar6 = (int)uVar7;
      if (iVar5 == iVar6) {
        if (iVar6 < 0x10) {
          if (vVisited->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(vVisited->pArray,0x80);
          }
          vVisited->pArray = ppvVar4;
          vVisited->nCap = 0x10;
          uVar7 = 0x10;
        }
        else {
          uVar7 = (ulong)(uint)(iVar6 * 2);
          if (vVisited->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(uVar7 * 8);
          }
          else {
            ppvVar4 = (void **)realloc(vVisited->pArray,uVar7 * 8);
          }
          vVisited->pArray = ppvVar4;
          vVisited->nCap = iVar6 * 2;
        }
      }
      else {
        ppvVar4 = vVisited->pArray;
      }
      iVar6 = vVisited->nSize;
      iVar5 = iVar6 + 1;
      vVisited->nSize = iVar5;
      ppvVar4[iVar6] = pvVar2;
      lVar3 = lVar3 + 1;
    } while (lVar3 < vLeaves->nSize);
  }
  if (0 < nRoots) {
    uVar7 = 0;
    do {
      Abc_NodeConeMarkCollect_rec(ppRoots[uVar7],vVisited);
      uVar7 = uVar7 + 1;
    } while ((uint)nRoots != uVar7);
  }
  if (0 < vLeaves->nSize) {
    lVar3 = 0;
    do {
      puVar1 = (uint *)((long)vLeaves->pArray[lVar3] + 0x14);
      *puVar1 = *puVar1 & 0xffffffef;
      lVar3 = lVar3 + 1;
    } while (lVar3 < vLeaves->nSize);
  }
  if (0 < vVisited->nSize) {
    lVar3 = 0;
    do {
      puVar1 = (uint *)((long)vVisited->pArray[lVar3] + 0x14);
      *puVar1 = *puVar1 & 0xffffffef;
      lVar3 = lVar3 + 1;
    } while (lVar3 < vVisited->nSize);
  }
  return;
}

Assistant:

void Abc_NodeConeCollect( Abc_Obj_t ** ppRoots, int nRoots, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vVisited, int fIncludeFanins )
{
    Abc_Obj_t * pTemp;
    int i;
    // mark the fanins of the cone
    Abc_NodesMark( vLeaves );
    // collect the nodes in the DFS order
    Vec_PtrClear( vVisited );
    // add the fanins
    if ( fIncludeFanins )
        Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pTemp, i )
            Vec_PtrPush( vVisited, pTemp );
    // add other nodes
    for ( i = 0; i < nRoots; i++ )
        Abc_NodeConeMarkCollect_rec( ppRoots[i], vVisited );
    // unmark both sets
    Abc_NodesUnmark( vLeaves );
    Abc_NodesUnmark( vVisited );
}